

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O0

void opengv::generateMulti2D2DCorrespondences
               (translation_t *position1,rotation_t *rotation1,translation_t *position2,
               rotation_t *rotation2,translations_t *camOffsets,rotations_t *camRotations,
               size_t pointsPerCam,double noise,double outlierFraction,
               vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
               *multiBearingVectors1,
               vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
               *multiBearingVectors2,
               vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
               *gt)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  undefined1 (*pauVar3) [16];
  element_type *peVar4;
  ulong uVar5;
  size_type sVar6;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_R8;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_R9;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  *in_XMM0_Qa;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_ZMM1 [64];
  ulong in_stack_00000008;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  *in_stack_00000018;
  vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  *in_stack_00000020;
  point_t bodyPoint;
  point_t p;
  size_t i_2;
  rotation_t camRotation_1;
  translation_t camOffset_1;
  size_t cam_2;
  size_t outliersPerCam;
  point_t bodyPoint2;
  point_t bodyPoint1;
  size_t i_1;
  rotation_t camRotation;
  translation_t camOffset;
  shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  bearingVectors2;
  shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  bearingVectors1;
  size_t cam_1;
  size_t i;
  shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> gt_sub;
  size_t cam;
  double maxDepth;
  double minDepth;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff958;
  __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffff960;
  value_type *in_stack_fffffffffffff968;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  *in_stack_fffffffffffff970;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  *in_stack_fffffffffffff978;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff980;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  *in_stack_fffffffffffff988;
  reference in_stack_fffffffffffff9a0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff9a8;
  double in_stack_fffffffffffffa70;
  double in_stack_fffffffffffffa78;
  size_type local_520;
  size_type local_4b8;
  Vector3d *in_stack_fffffffffffffbd0;
  double in_stack_fffffffffffffbd8;
  size_type local_168;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_100 [32];
  ulong local_e0;
  ulong local_88;
  undefined4 local_6c;
  ulong local_58;
  undefined8 local_50;
  ulong local_48;
  double local_40;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  *local_38;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *local_30;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_28;
  
  local_40 = in_ZMM1._0_8_;
  local_48 = 0x4010000000000000;
  local_50 = 0x4020000000000000;
  local_58 = 0;
  local_38 = in_XMM0_Qa;
  local_30 = in_R9;
  local_28 = in_R8;
  while( true ) {
    uVar5 = local_58;
    sVar2 = std::
            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::size(local_28);
    if (sVar2 <= uVar5) break;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_new(0x1298b92);
    local_6c = 3;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff980,
               (int *)in_stack_fffffffffffff978,(unsigned_long *)in_stack_fffffffffffff970);
    std::shared_ptr<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    shared_ptr<Eigen::Matrix<double,_1,_1,0,_1,_1>,void>
              ((shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff960,
               (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff958);
    for (local_88 = 0; local_88 < in_stack_00000008; local_88 = local_88 + 1) {
      in_ZMM1 = ZEXT864(local_48);
      generateRandomPoint(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
      std::
      __shared_ptr_access<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1298c27);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff970,
                 (Index)in_stack_fffffffffffff968);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                 in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    }
    std::
    vector<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
    ::push_back((vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                 *)in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~shared_ptr
              ((shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x1298ce3);
    local_58 = local_58 + 1;
  }
  local_e0 = 0;
  while( true ) {
    uVar5 = local_e0;
    sVar2 = std::
            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::size(local_28);
    if (sVar2 <= uVar5) break;
    pauVar3 = (undefined1 (*) [16])operator_new(0x18);
    *pauVar3 = (undefined1  [16])0x0;
    *(undefined8 *)pauVar3[1] = 0;
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)0x1298d66);
    std::
    shared_ptr<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>>
    ::
    shared_ptr<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>,void>
              ((shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffff960,
               (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffff958);
    pauVar3 = (undefined1 (*) [16])operator_new(0x18);
    *pauVar3 = (undefined1  [16])0x0;
    *(undefined8 *)pauVar3[1] = 0;
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)0x1298dae);
    std::
    shared_ptr<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>>
    ::
    shared_ptr<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>,void>
              ((shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffff960,
               (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffff958);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](local_28,local_e0);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff960,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff958);
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::operator[](local_30,local_e0);
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff960,
               (Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff958);
    for (local_168 = 0; local_168 < in_stack_00000008; local_168 = local_168 + 1) {
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff958);
      std::
      vector<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
      ::operator[](in_stack_00000020,local_e0);
      std::
      __shared_ptr_access<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1298e7b);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff970,
                 (Index)in_stack_fffffffffffff968);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator-
                (in_stack_fffffffffffff988,in_stack_fffffffffffff980);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>>::operator*
                ((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                 in_stack_fffffffffffff978,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_fffffffffffff970);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff960,
                 (EigenBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                  *)in_stack_fffffffffffff958);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff958);
      std::
      vector<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
      ::operator[](in_stack_00000020,local_e0);
      std::
      __shared_ptr_access<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1298f28);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff970,
                 (Index)in_stack_fffffffffffff968);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator-
                (in_stack_fffffffffffff988,in_stack_fffffffffffff980);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>>::operator*
                ((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                 in_stack_fffffffffffff978,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_fffffffffffff970);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff960,
                 (EigenBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                  *)in_stack_fffffffffffff958);
      std::
      __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1298fa4);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff958);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff988,
                 in_stack_fffffffffffff980);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
                ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                 in_stack_fffffffffffff978,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_fffffffffffff970);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff960,
                 (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                  *)in_stack_fffffffffffff958);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *)in_stack_fffffffffffff960,(value_type *)in_stack_fffffffffffff958);
      std::
      __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1299040);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff958);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff988,
                 in_stack_fffffffffffff980);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
                ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                 in_stack_fffffffffffff978,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_fffffffffffff970);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff960,
                 (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                  *)in_stack_fffffffffffff958);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *)in_stack_fffffffffffff960,(value_type *)in_stack_fffffffffffff958);
      peVar4 = std::
               __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_fffffffffffff960);
      in_stack_fffffffffffff9a0 =
           std::
           vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ::operator[](peVar4,local_168);
      peVar4 = std::
               __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_fffffffffffff960);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](peVar4,local_168);
      in_stack_fffffffffffff9a8 =
           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                     ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff958
                     );
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
                (in_stack_fffffffffffff9a8,(double *)in_stack_fffffffffffff9a0);
      peVar4 = std::
               __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_fffffffffffff960);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](peVar4,local_168);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff960,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)in_stack_fffffffffffff958);
      in_stack_fffffffffffff980 = local_100;
      peVar4 = std::
               __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_fffffffffffff960);
      in_stack_fffffffffffff988 =
           (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
           std::
           vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ::operator[](peVar4,local_168);
      peVar4 = std::
               __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_fffffffffffff960);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](peVar4,local_168);
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff958);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
                (in_stack_fffffffffffff9a8,(double *)in_stack_fffffffffffff9a0);
      peVar4 = std::
               __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_fffffffffffff960);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](peVar4,local_168);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff960,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)in_stack_fffffffffffff958);
      in_ZMM1 = ZEXT1664((undefined1  [16])0x0);
      if (0.0 < (double)local_38) {
        in_stack_fffffffffffff978 = local_38;
        peVar4 = std::
                 __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*(in_stack_fffffffffffff960);
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::operator[](peVar4,local_168);
        Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                  ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff960,
                   (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff958);
        addNoise(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
        peVar4 = std::
                 __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*(in_stack_fffffffffffff960);
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::operator[](peVar4,local_168);
        Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                  ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff960,
                   (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff958);
        in_stack_fffffffffffff970 = local_38;
        peVar4 = std::
                 __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*(in_stack_fffffffffffff960);
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::operator[](peVar4,local_168);
        Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                  ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff960,
                   (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff958);
        addNoise(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
        peVar4 = std::
                 __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*(in_stack_fffffffffffff960);
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::operator[](peVar4,local_168);
        Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                  ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff960,
                   (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff958);
      }
    }
    std::
    vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
    ::push_back(in_stack_fffffffffffff970,(value_type *)in_stack_fffffffffffff968);
    std::
    vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
    ::push_back(in_stack_fffffffffffff970,(value_type *)in_stack_fffffffffffff968);
    std::
    shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
    ::~shared_ptr((shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                   *)0x129942f);
    std::
    shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
    ::~shared_ptr((shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                   *)0x129943c);
    local_e0 = local_e0 + 1;
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_40;
  auVar1 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,in_stack_00000008);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_40 * auVar1._0_8_;
  auVar1 = vroundsd_avx(auVar7,auVar8,9);
  uVar5 = vcvttsd2usi_avx512f(auVar1);
  local_4b8 = 0;
  while( true ) {
    sVar2 = local_4b8;
    sVar6 = std::
            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::size(local_28);
    if (sVar6 <= sVar2) break;
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](local_28,local_4b8);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff960,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff958);
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::operator[](local_30,local_4b8);
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff960,
               (Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff958);
    for (local_520 = 0; local_520 < uVar5; local_520 = local_520 + 1) {
      generateRandomPoint(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff958);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff988,
                 in_stack_fffffffffffff980);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>>::operator*
                ((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                 in_stack_fffffffffffff978,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_fffffffffffff970);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff960,
                 (EigenBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                  *)in_stack_fffffffffffff958);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff958);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff988,
                 in_stack_fffffffffffff980);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
                ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                 in_stack_fffffffffffff978,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_fffffffffffff970);
      std::
      vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
      ::operator[](in_stack_00000018,local_4b8);
      peVar4 = std::
               __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_fffffffffffff960);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](peVar4,local_520);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff960,
                 (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                  *)in_stack_fffffffffffff958);
      std::
      vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
      ::operator[](in_stack_00000018,local_4b8);
      peVar4 = std::
               __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_fffffffffffff960);
      in_stack_fffffffffffff960 =
           (__shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[](peVar4,local_520);
      std::
      vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
      ::operator[](in_stack_00000018,local_4b8);
      peVar4 = std::
               __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_fffffffffffff960);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](peVar4,local_520);
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff958);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
                (in_stack_fffffffffffff9a8,(double *)in_stack_fffffffffffff9a0);
      std::
      vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
      ::operator[](in_stack_00000018,local_4b8);
      peVar4 = std::
               __shared_ptr_access<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_fffffffffffff960);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](peVar4,local_520);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff960,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)in_stack_fffffffffffff958);
    }
    local_4b8 = local_4b8 + 1;
  }
  return;
}

Assistant:

void
opengv::generateMulti2D2DCorrespondences(
    const translation_t & position1,
    const rotation_t & rotation1,
    const translation_t & position2,
    const rotation_t & rotation2,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    size_t pointsPerCam,
    double noise,
    double outlierFraction,
    std::vector<std::shared_ptr<bearingVectors_t> > & multiBearingVectors1,
    std::vector<std::shared_ptr<bearingVectors_t> > & multiBearingVectors2,
    std::vector<std::shared_ptr<Eigen::MatrixXd> > & gt )
{
  //initialize point-cloud
  double minDepth = 4;
  double maxDepth = 8;

  for( size_t cam = 0; cam < camOffsets.size(); cam++ )
  {
    std::shared_ptr<Eigen::MatrixXd> gt_sub(new Eigen::MatrixXd(3,pointsPerCam));
    for( size_t i = 0; i < pointsPerCam; i++ )
      gt_sub->col(i) = generateRandomPoint( maxDepth, minDepth );
    gt.push_back(gt_sub);
  }

  //iterate through the cameras (pairs)
  for( size_t cam = 0; cam < camOffsets.size(); cam++ )
  {
    //create the bearing-vector arrays for this camera
    std::shared_ptr<bearingVectors_t> bearingVectors1(new bearingVectors_t());
    std::shared_ptr<bearingVectors_t> bearingVectors2(new bearingVectors_t());

    //get the offset and rotation of this camera
    translation_t camOffset = camOffsets[cam];
    rotation_t camRotation = camRotations[cam];

    //now iterate through the points of that camera
    for( size_t i = 0; i < (size_t) pointsPerCam; i++ )
    {
      //project a point into both viewpoint frames
      point_t bodyPoint1 = rotation1.transpose()*(gt[cam]->col(i) - position1);
      point_t bodyPoint2 = rotation2.transpose()*(gt[cam]->col(i) - position2);

      //project that point into the cameras
      bearingVectors1->push_back( camRotation.transpose()*(bodyPoint1 - camOffset) );
      bearingVectors2->push_back( camRotation.transpose()*(bodyPoint2 - camOffset) );

      //normalize the vectors
      (*bearingVectors1)[i] = (*bearingVectors1)[i] / (*bearingVectors1)[i].norm();
      (*bearingVectors2)[i] = (*bearingVectors2)[i] / (*bearingVectors2)[i].norm();

      //add noise
      if( noise > 0.0 )
      {
        (*bearingVectors1)[i] = addNoise(noise,(*bearingVectors1)[i]);
        (*bearingVectors2)[i] = addNoise(noise,(*bearingVectors2)[i]);
      }
    }

    //push back the stuff for this camera
    multiBearingVectors1.push_back(bearingVectors1);
    multiBearingVectors2.push_back(bearingVectors2);
  }

  //add outliers
  size_t outliersPerCam = (size_t) floor(outlierFraction*pointsPerCam);

  //iterate through the cameras
  for(size_t cam = 0; cam < camOffsets.size(); cam++)
  {
    //get the offset and rotation of this camera
    translation_t camOffset = camOffsets[cam];
    rotation_t camRotation = camRotations[cam];

    //add outliers
    for(size_t i = 0; i < outliersPerCam; i++)
    {
      //generate a random point
      point_t p = generateRandomPoint(8,4);

      //transform that point into viewpoint 2 only
      point_t bodyPoint = rotation2.transpose()*(p - position2);

      //use as measurement (outlier)
      (*multiBearingVectors2[cam])[i] =
          camRotation.transpose()*(bodyPoint - camOffset);

      //normalize
      (*multiBearingVectors2[cam])[i] =
          (*multiBearingVectors2[cam])[i] / (*multiBearingVectors2[cam])[i].norm();
    }
  }
}